

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtThreadSupportPosix.cpp
# Opt level: O3

int __thiscall cbtThreadSupportPosix::waitForResponse(cbtThreadSupportPosix *this)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint *puVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  
  iVar2 = sem_wait((sem_t *)this->m_mainSemaphore);
  if (iVar2 != 0) {
    uVar3 = sem_wait((sem_t *)this->m_mainSemaphore);
    puVar4 = (uint *)__errno_location();
    printf("PThread problem at line %i in file %s: %i %d\n",0xea,
           "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/bullet/LinearMath/TaskScheduler/cbtThreadSupportPosix.cpp"
           ,(ulong)uVar3,(ulong)*puVar4);
  }
  uVar6 = 0xffffffffffffffff;
  if ((this->m_activeThreadStatus).m_size != 0) {
    lVar7 = 0;
    uVar5 = 0;
    do {
      (*this->m_cs->_vptr_cbtCriticalSection[2])();
      iVar2 = (this->m_activeThreadStatus).m_data[lVar7 >> 0x20].m_status;
      (*this->m_cs->_vptr_cbtCriticalSection[3])();
      uVar6 = uVar5;
      if (iVar2 == 2) break;
      uVar5 = uVar5 + 1;
      lVar7 = lVar7 + 0x100000000;
      uVar6 = 0xffffffffffffffff;
    } while (uVar5 < (ulong)(long)(this->m_activeThreadStatus).m_size);
  }
  (this->m_activeThreadStatus).m_data[(int)uVar6].m_status = 0;
  bVar1 = (byte)uVar6 & 0x3f;
  this->m_startedThreadsMask =
       this->m_startedThreadsMask & (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1);
  return (int)uVar6;
}

Assistant:

int cbtThreadSupportPosix::waitForResponse()
{
	///We should wait for (one of) the first tasks to finish (or other SPU messages), and report its response
	///A possible response can be 'yes, SPU handled it', or 'no, please do a PPU fallback'

	cbtAssert(m_activeThreadStatus.size());

	// wait for any of the threads to finish
	checkPThreadFunction(sem_wait(m_mainSemaphore));
	// get at least one thread which has finished
	size_t last = -1;

	for (size_t t = 0; t < size_t(m_activeThreadStatus.size()); ++t)
	{
		m_cs->lock();
		bool hasFinished = (2 == m_activeThreadStatus[t].m_status);
		m_cs->unlock(); 
		if (hasFinished)
		{
			last = t;
			break;
		}
	}

	cbtThreadStatus& threadStatus = m_activeThreadStatus[last];

	cbtAssert(threadStatus.m_status > 1);
	threadStatus.m_status = 0;

	// need to find an active spu
	cbtAssert(last >= 0);
	m_startedThreadsMask &= ~(UINT64(1) << last);

	return last;
}